

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void ma_wrench_add(ma_wrench *f1,ma_wrench *f2,ma_wrench *r)

{
  frame *pfVar1;
  frame *pfVar2;
  point *ppVar3;
  
  if (f1 == (ma_wrench *)0x0) {
    __assert_fail("f1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xab,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (f2 == (ma_wrench *)0x0) {
    __assert_fail("f2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xac,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (r == (ma_wrench *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xad,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  pfVar1 = f1->frame;
  if (pfVar1 == (frame *)0x0) {
    __assert_fail("f1->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xae,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  pfVar2 = f2->frame;
  if (pfVar2 == (frame *)0x0) {
    __assert_fail("f2->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xaf,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  ppVar3 = f1->point;
  if (pfVar1->origin != ppVar3) {
    __assert_fail("f1->frame->origin == f1->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xb0,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (pfVar2->origin != f2->point) {
    __assert_fail("f2->frame->origin == f2->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xb1,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (f1->body == f2->body) {
    if (pfVar1->origin != pfVar2->origin) {
      __assert_fail("f1->point == f2->point",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                    ,0xb3,
                    "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                   );
    }
    if (pfVar1 == pfVar2) {
      r->body = f1->body;
      r->point = ppVar3;
      r->frame = pfVar1;
      return;
    }
    __assert_fail("f1->frame == f2->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0xb4,
                  "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  __assert_fail("f1->body == f2->body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0xb2,
                "void ma_wrench_add(const struct ma_wrench *, const struct ma_wrench *, struct ma_wrench *)"
               );
}

Assistant:

void ma_wrench_add(
        const struct ma_wrench *f1,
        const struct ma_wrench *f2,
        struct ma_wrench *r)
{
    assert(f1);
    assert(f2);
    assert(r);
    assert(f1->frame);
    assert(f2->frame);
    assert(f1->frame->origin == f1->point);
    assert(f2->frame->origin == f2->point);
    assert(f1->body == f2->body);
    assert(f1->point == f2->point);
    assert(f1->frame == f2->frame);

    r->body = f1->body;
    r->point = f1->point;
    r->frame = f1->frame;
}